

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasLazyFields
               (FileDescriptor *file,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  MessageSCCAnalyzer *extraout_RDX;
  MessageSCCAnalyzer *extraout_RDX_00;
  MessageSCCAnalyzer *extraout_RDX_01;
  MessageSCCAnalyzer *pMVar2;
  MessageSCCAnalyzer *extraout_RDX_02;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  bVar3 = 0 < *(int *)(file + 0x2c);
  pMVar2 = scc_analyzer;
  if (0 < *(int *)(file + 0x2c)) {
    bVar1 = HasLazyFields(*(Descriptor **)(file + 0x58),options,scc_analyzer);
    pMVar2 = extraout_RDX;
    if (!bVar1) {
      lVar5 = 0;
      lVar4 = 0x88;
      do {
        lVar5 = lVar5 + 1;
        bVar3 = lVar5 < *(int *)(file + 0x2c);
        if (*(int *)(file + 0x2c) <= lVar5) goto LAB_00240c1a;
        bVar1 = HasLazyFields((Descriptor *)(lVar4 + *(long *)(file + 0x58)),options,scc_analyzer);
        pMVar2 = extraout_RDX_00;
        lVar4 = lVar4 + 0x88;
      } while (!bVar1);
    }
    if (bVar3) {
      return true;
    }
  }
LAB_00240c1a:
  bVar3 = 0 < *(int *)(file + 0x3c);
  if ((0 < *(int *)(file + 0x3c)) &&
     (bVar1 = IsLazy(*(FieldDescriptor **)(file + 0x70),options,pMVar2), !bVar1)) {
    lVar5 = 0;
    pMVar2 = extraout_RDX_01;
    lVar4 = 0x48;
    do {
      lVar5 = lVar5 + 1;
      bVar3 = lVar5 < *(int *)(file + 0x3c);
      if (*(int *)(file + 0x3c) <= lVar5) {
        return bVar3;
      }
      bVar1 = IsLazy((FieldDescriptor *)(lVar4 + *(long *)(file + 0x70)),options,pMVar2);
      pMVar2 = extraout_RDX_02;
      lVar4 = lVar4 + 0x48;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

bool HasLazyFields(const FileDescriptor* file, const Options& options,
                   MessageSCCAnalyzer* scc_analyzer) {
  for (int i = 0; i < file->message_type_count(); i++) {
    const Descriptor* descriptor(file->message_type(i));
    if (HasLazyFields(descriptor, options, scc_analyzer)) {
      return true;
    }
  }
  for (int field_idx = 0; field_idx < file->extension_count(); field_idx++) {
    if (IsLazy(file->extension(field_idx), options, scc_analyzer)) {
      return true;
    }
  }
  return false;
}